

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall
wabt::SharedValidator::OnMemoryInit
          (SharedValidator *this,Location *loc,Var *segment_var,Var *memidx)

{
  Result rhs;
  char *pcVar1;
  int __c;
  Var local_f0;
  Enum local_a4;
  Var local_a0;
  Enum local_54;
  undefined1 local_50 [8];
  MemoryType mt;
  Var *memidx_local;
  Var *segment_var_local;
  Location *loc_local;
  SharedValidator *this_local;
  Result result;
  
  Opcode::Opcode((Opcode *)&mt.limits.field_0x14,MemoryInit);
  this_local._4_4_ = CheckInstr(this,(Opcode)mt.limits._20_4_,loc);
  MemoryType::MemoryType((MemoryType *)local_50);
  Var::Var(&local_a0,memidx);
  local_54 = (Enum)CheckMemoryIndex(this,&local_a0,(MemoryType *)local_50);
  Result::operator|=((Result *)((long)&this_local + 4),(Result)local_54);
  Var::~Var(&local_a0);
  Var::Var(&local_f0,segment_var);
  local_a4 = (Enum)CheckDataSegmentIndex(this,&local_f0);
  pcVar1 = (char *)(ulong)local_a4;
  Result::operator|=((Result *)((long)&this_local + 4),(Result)local_a4);
  Var::~Var(&local_f0);
  pcVar1 = Var::index(segment_var,pcVar1,__c);
  rhs = TypeChecker::OnMemoryInit(&this->typechecker_,(uint32_t)pcVar1,(Limits *)local_50);
  Result::operator|=((Result *)((long)&this_local + 4),rhs);
  return (Result)this_local._4_4_;
}

Assistant:

Result SharedValidator::OnMemoryInit(const Location& loc,
                                     Var segment_var,
                                     Var memidx) {
  Result result = CheckInstr(Opcode::MemoryInit, loc);
  MemoryType mt;
  result |= CheckMemoryIndex(memidx, &mt);
  result |= CheckDataSegmentIndex(segment_var);
  result |= typechecker_.OnMemoryInit(segment_var.index(), mt.limits);
  return result;
}